

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_alps_parse_serverhello_impl
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents,bool use_new_codepoint)

{
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  pointer psVar3;
  Span<const_unsigned_char> in;
  SSL *ssl;
  bool use_new_codepoint_local;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    if ((((byte)(*(ushort *)&ssl_00->s3->field_0xdc >> 4) & 1 ^ 0xff) & 1) == 0) {
      __assert_fail("!ssl->s3->initial_handshake_complete",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd1f,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    bVar1 = Array<unsigned_char>::empty(&hs->config->alpn_client_proto_list);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!hs->config->alpn_client_proto_list.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd20,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    bVar1 = Vector<bssl::ALPSConfig>::empty(&hs->config->alps_configs);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!hs->config->alps_configs.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd21,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    if (use_new_codepoint !=
        (bool)((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 0xd) & 1)) {
      __assert_fail("use_new_codepoint == hs->config->alps_use_new_codepoint",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd22,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    uVar2 = ssl_protocol_version(ssl_00);
    if (uVar2 < 0x304) {
      *out_alert = 'n';
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd27);
      hs_local._7_1_ = false;
    }
    else {
      psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&hs->new_session);
      in = cbs_st::operator_cast_to_Span(contents);
      bVar1 = Array<unsigned_char>::CopyFrom(&psVar3->peer_application_settings,in);
      if (bVar1) {
        psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           (&hs->new_session);
        psVar3->field_0x1b8 = psVar3->field_0x1b8 & 0xbf | 0x40;
        hs_local._7_1_ = true;
      }
      else {
        *out_alert = 'P';
        hs_local._7_1_ = false;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *hs,
                                            uint8_t *out_alert, CBS *contents,
                                            bool use_new_codepoint) {
  SSL *const ssl = hs->ssl;
  if (contents == nullptr) {
    return true;
  }

  assert(!ssl->s3->initial_handshake_complete);
  assert(!hs->config->alpn_client_proto_list.empty());
  assert(!hs->config->alps_configs.empty());
  assert(use_new_codepoint == hs->config->alps_use_new_codepoint);

  // ALPS requires TLS 1.3.
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    return false;
  }

  // Note extension callbacks may run in any order, so we defer checking
  // consistency with ALPN to |ssl_check_serverhello_tlsext|.
  if (!hs->new_session->peer_application_settings.CopyFrom(*contents)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  hs->new_session->has_application_settings = true;
  return true;
}